

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O2

double tinv_appx(double p,int df)

{
  char *__format;
  double dVar1;
  double __x;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (df < 1) {
    __format = "Degree Of Freedom should be a real integer";
  }
  else {
    if ((0.0 <= p) && (p <= 1.0)) {
      dVar1 = *(double *)(&DAT_00150930 + (ulong)(-(uint)(p == 1.0) & 1) * 8);
      if ((0.0 < p) && (p < 1.0)) {
        dVar1 = normalinv(p,0.0,1.0);
        __x = (double)df;
        dVar2 = pow(dVar1,3.0);
        dVar3 = pow(dVar1,5.0);
        dVar4 = pow(dVar1,3.0);
        dVar5 = pow(dVar1,7.0);
        dVar6 = pow(dVar1,5.0);
        dVar7 = pow(dVar1,3.0);
        dVar8 = pow(__x,3.0);
        dVar9 = pow(dVar1,9.0);
        dVar10 = pow(dVar1,7.0);
        dVar11 = pow(dVar1,5.0);
        dVar12 = pow(dVar1,3.0);
        dVar13 = pow(__x,4.0);
        dVar1 = (dVar2 + dVar1) / (__x * 4.0) + dVar1 +
                (dVar1 * 3.0 + dVar3 * 5.0 + dVar4 * 16.0) / (__x * __x * 96.0) +
                (dVar1 * -15.0 + dVar7 * 17.0 + dVar5 * 3.0 + dVar6 * 19.0) / (dVar8 * 384.0) +
                (dVar1 * -945.0 + dVar12 * -1920.0 + dVar11 * 1482.0 + dVar9 * 79.0 + dVar10 * 776.0
                ) / (dVar13 * 92160.0);
      }
      return dVar1;
    }
    __format = "Probablity Values can only take values between 0.0 and 1.0";
  }
  printf(__format);
  exit(1);
}

Assistant:

double tinv_appx(double p, int df) {
	double t,x,d,g1,g2,g3,g4;
	/*
	 * Abramowitz and Stegun Approximation 26.7.5
	 */ 
	 
	if (df <= 0) {
		printf("Degree Of Freedom should be a real integer");
		exit(1);
	}
	
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	} 
	
	if ( p == 0.) {
		t = -XINFVAL;
	}
	
	if ( p == 1.) {
		t = XINFVAL;
	}
	
	if (p > 0. && p < 1.0) {
		x = normalinv(p,0.0,1.0);
		d = (double) df;
		g1 = (pow(x,3.0) + x ) / (4. * d);
		g2 = (5. * pow(x,5.0) + 16. * pow(x,3.0) + 3. * x) / (96. * pow(d, 2.0)); 
		g3 = (3. * pow(x,7.0) + 19. * pow(x,5.0) + 17. * pow(x,3.0) - 15. * x)\
		/(384. * pow(d, 3.0)); 
		g4 = (79. * pow(x,9.0) + 776. * pow(x,7.0) + 1482. * pow(x,5.0) - 1920. *\
		 pow(x,3.0) - 945. * x)/(92160. * pow(d, 4.0)); 
		 t = x + g1 + g2 + g3 + g4;
	}
	
	return t;
}